

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall
FourByteUtf8ChineseCharacters_IndexCstr_Test::FourByteUtf8ChineseCharacters_IndexCstr_Test
          (FourByteUtf8ChineseCharacters_IndexCstr_Test *this)

{
  FourByteUtf8ChineseCharacters_IndexCstr_Test *this_local;
  
  anon_unknown.dwarf_d9fbb::FourByteUtf8ChineseCharacters::FourByteUtf8ChineseCharacters
            (&this->super_FourByteUtf8ChineseCharacters);
  (this->super_FourByteUtf8ChineseCharacters).super_Test._vptr_Test =
       (_func_int **)&PTR__FourByteUtf8ChineseCharacters_IndexCstr_Test_00322940;
  return;
}

Assistant:

TEST_F (FourByteUtf8ChineseCharacters, IndexCstr) {
    char const * strz = str.c_str ();
    ASSERT_EQ (strz + 0, pstore::utf::index (strz, 0));
    ASSERT_EQ (strz + 4, pstore::utf::index (strz, 1));
    ASSERT_EQ (strz + 8, pstore::utf::index (strz, 2));
    ASSERT_EQ (strz + 12, pstore::utf::index (strz, 3));
    ASSERT_EQ (static_cast<char const *> (nullptr), pstore::utf::index (strz, 4));
}